

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.h
# Opt level: O2

void __thiscall FBX::Texture::Texture(Texture *this,Node *node)

{
  variant_alternative_t<5UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar1;
  variant_alternative_t<6UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar2;
  allocator<char> local_51;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_50;
  string local_38;
  
  pvVar1 = std::
           get<5ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     ((node->properties).
                      super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  (this->super_Object).id = *pvVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"FileName",&local_51);
  findNodes(&local_50,node,&local_38);
  pvVar2 = std::
           get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     (((local_50.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                        super__Vector_impl_data._M_start)->properties).
                      super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::string((string *)&this->absolutePath,(string *)pvVar2);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_50);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"RelativeFilename",&local_51);
  findNodes(&local_50,node,&local_38);
  pvVar2 = std::
           get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     (((local_50.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                        super__Vector_impl_data._M_start)->properties).
                      super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::string((string *)&this->relativePath,(string *)pvVar2);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_50);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

explicit Texture(const Node &node) :
                Object(std::get<int64_t>(node.properties[0])),
                absolutePath(std::get<std::string>(findNodes(node, "FileName")[0].properties[0])),
                relativePath(std::get<std::string>(findNodes(node, "RelativeFilename")[0].properties[0])) {}